

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<int,_27> * __thiscall
TPZManVector<int,_27>::operator=(TPZManVector<int,_27> *this,initializer_list<int> *list)

{
  ulong uVar1;
  size_type sVar2;
  iterator piVar3;
  int *piVar4;
  long lVar5;
  
  uVar1 = list->_M_len;
  if (((ulong)(this->super_TPZVec<int>).fNAlloc < uVar1) &&
     (piVar4 = (this->super_TPZVec<int>).fStore, piVar4 != this->fExtAlloc && piVar4 != (int *)0x0))
  {
    operator_delete__(piVar4);
    (this->super_TPZVec<int>).fStore = (int *)0x0;
    (this->super_TPZVec<int>).fNAlloc = 0;
  }
  if (uVar1 < 0x1c) {
    piVar4 = (this->super_TPZVec<int>).fStore;
    if (piVar4 != (int *)0x0 && piVar4 != this->fExtAlloc) {
      operator_delete__(piVar4);
    }
    (this->super_TPZVec<int>).fNAlloc = 0;
    (this->super_TPZVec<int>).fStore = this->fExtAlloc;
  }
  else if ((ulong)(this->super_TPZVec<int>).fNAlloc < uVar1) {
    piVar4 = (int *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    (this->super_TPZVec<int>).fStore = piVar4;
    (this->super_TPZVec<int>).fNAlloc = uVar1;
  }
  (this->super_TPZVec<int>).fNElements = uVar1;
  sVar2 = list->_M_len;
  if (sVar2 != 0) {
    piVar3 = list->_M_array;
    piVar4 = (this->super_TPZVec<int>).fStore;
    lVar5 = 0;
    do {
      *(undefined4 *)((long)piVar4 + lVar5) = *(undefined4 *)((long)piVar3 + lVar5);
      lVar5 = lVar5 + 4;
    } while (sVar2 << 2 != lVar5);
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const std::initializer_list<T>& list) {
	size_t size = list.size();

	if (size > this->fNAlloc && this->fStore && this->fStore != this->fExtAlloc) {
		delete[] this->fStore;
		this->fStore = 0;
		this->fNAlloc = 0;
	}

	if (size <= NumExtAlloc) {
		if (this->fStore != fExtAlloc) {
			delete[]this->fStore;
		}
		this->fNAlloc = 0;
		this->fStore = fExtAlloc;
		this->fNElements = size;
	}
	else if (this->fNAlloc >= size) {
		this->fNElements = size;
	}
	else {
		this->fStore = new T[size];
		this->fNAlloc = size;
		this->fNElements = size;
	}

	auto it_end = list.end();
	T* aux = this->fStore;
	for (auto it = list.begin(); it != it_end; it++, aux++)
		*aux = *it;

	return *this;
}